

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O1

void __thiscall QUrlPrivate::~QUrlPrivate(QUrlPrivate *this)

{
  Error *__ptr;
  Data *pDVar1;
  
  __ptr = (this->error)._M_t.
          super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
          super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
          super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl;
  if (__ptr != (Error *)0x0) {
    std::default_delete<QUrlPrivate::Error>::operator()
              ((default_delete<QUrlPrivate::Error> *)&this->error,__ptr);
  }
  (this->error)._M_t.
  super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
  super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
  super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl = (Error *)0x0;
  pDVar1 = (this->fragment).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->fragment).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->query).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->query).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->path).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->path).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->host).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->host).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->password).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->password).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->userName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->userName).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->scheme).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->scheme).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

inline QUrlPrivate::~QUrlPrivate()
    = default;